

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

int32 acmod_set_set_n_tri_hint(acmod_set_t *acmod_set,uint32 n_tri)

{
  acmod_t *paVar1;
  uint32 n_tri_local;
  acmod_set_t *acmod_set_local;
  
  if (acmod_set->multi != (acmod_t *)0x0) {
    __assert_fail("acmod_set->multi == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                  ,0xbb,"int32 acmod_set_set_n_tri_hint(acmod_set_t *, uint32)");
  }
  if (acmod_set->max_n_multi == 0) {
    if (acmod_set->n_multi == 0) {
      if (n_tri != 0) {
        paVar1 = (acmod_t *)
                 __ckd_calloc__((ulong)n_tri,0x10,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                                ,0xc1);
        acmod_set->multi = paVar1;
        acmod_set->max_n_multi = n_tri;
      }
      return 0;
    }
    __assert_fail("acmod_set->n_multi == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                  ,0xbd,"int32 acmod_set_set_n_tri_hint(acmod_set_t *, uint32)");
  }
  __assert_fail("acmod_set->max_n_multi == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                ,0xbc,"int32 acmod_set_set_n_tri_hint(acmod_set_t *, uint32)");
}

Assistant:

int32
acmod_set_set_n_tri_hint(acmod_set_t *acmod_set,
			 uint32 n_tri)
{
    assert(acmod_set->multi == NULL);
    assert(acmod_set->max_n_multi == 0);
    assert(acmod_set->n_multi == 0);
    
    if (n_tri > 0) {
	acmod_set->multi = ckd_calloc(n_tri,
				      sizeof(acmod_t));

	acmod_set->max_n_multi = n_tri;
    }

    return S3_SUCCESS;
}